

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

String * __thiscall
kj::encodeHex(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input)

{
  Iterator __begin1;
  uchar *puVar1;
  Iterator __end1;
  
  heapString(__return_storage_ptr__,(long)input.ptr * 2);
  for (puVar1 = (uchar *)0x0; input.ptr != puVar1; puVar1 = puVar1 + 1) {
    (__return_storage_ptr__->content).ptr[(long)puVar1 * 2] =
         "0123456789abcdef"[(byte)this[(long)puVar1] >> 4];
    (__return_storage_ptr__->content).ptr[(long)puVar1 * 2 + 1] =
         "0123456789abcdef"[(byte)this[(long)puVar1] & 0xf];
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeHex(ArrayPtr<const byte> input) {
  auto result = heapString(input.size() * 2);
  for (auto i: kj::indices(input)) {
    result[i*2] = HEX_DIGITS[input[i] / 16];
    result[i*2+1] = HEX_DIGITS[input[i] % 16];
  }
  return result;
}